

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O0

path_type CLI::detail::check_path(char *file)

{
  int iVar1;
  path_type local_a9;
  undefined1 local_a8 [8];
  stat buffer;
  char *file_local;
  
  buffer.__glibc_reserved[2] = (__syscall_slong_t)file;
  iVar1 = stat(file,(stat *)local_a8);
  if (iVar1 == 0) {
    local_a9 = directory;
    if (((uint)buffer.st_nlink & 0x4000) == 0) {
      local_a9 = file;
    }
    file_local._7_1_ = local_a9;
  }
  else {
    file_local._7_1_ = nonexistent;
  }
  return file_local._7_1_;
}

Assistant:

CLI11_INLINE path_type check_path(const char *file) noexcept {
#if defined(_MSC_VER)
    struct __stat64 buffer;
    if(_stat64(file, &buffer) == 0) {
        return ((buffer.st_mode & S_IFDIR) != 0) ? path_type::directory : path_type::file;
    }
#else
    struct stat buffer;
    if(stat(file, &buffer) == 0) {
        return ((buffer.st_mode & S_IFDIR) != 0) ? path_type::directory : path_type::file;
    }
#endif
    return path_type::nonexistent;
}